

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int difference_uint16(uint16_t *a1,int length1,uint16_t *a2,int length2,uint16_t *a_out)

{
  ushort local_48;
  ushort local_46;
  int local_44;
  uint16_t s2;
  uint16_t s1;
  int k2;
  int k1;
  int out_card;
  uint16_t *a_out_local;
  int length2_local;
  uint16_t *a2_local;
  int length1_local;
  uint16_t *a1_local;
  
  k2 = 0;
  _s2 = 0;
  local_44 = 0;
  if (length1 == 0) {
    a1_local._4_4_ = 0;
  }
  else {
    if (length2 != 0) {
      local_46 = *a1;
      local_48 = *a2;
      do {
        while (local_46 < local_48) {
          a_out[k2] = local_46;
          _s2 = _s2 + 1;
          if (length1 <= _s2) {
            return k2 + 1;
          }
          k2 = k2 + 1;
          local_46 = a1[_s2];
        }
        if (local_46 == local_48) {
          _s2 = _s2 + 1;
          if (length1 <= _s2) {
            return k2;
          }
          if (length2 <= local_44 + 1) {
            memmove(a_out + k2,a1 + _s2,(long)(length1 - _s2) << 1);
            return (k2 + length1) - _s2;
          }
          local_46 = a1[_s2];
          local_48 = a2[local_44 + 1];
        }
        else {
          if (length2 <= local_44 + 1) {
            memmove(a_out + k2,a1 + _s2,(long)(length1 - _s2) << 1);
            return (k2 + length1) - _s2;
          }
          local_48 = a2[local_44 + 1];
        }
        local_44 = local_44 + 1;
      } while( true );
    }
    a1_local._4_4_ = length1;
    if (a1 != a_out) {
      memcpy(a_out,a1,(long)length1 << 1);
    }
  }
  return a1_local._4_4_;
}

Assistant:

int difference_uint16(const uint16_t *a1, int length1, const uint16_t *a2,
                      int length2, uint16_t *a_out) {
    int out_card = 0;
    int k1 = 0, k2 = 0;
    if (length1 == 0) return 0;
    if (length2 == 0) {
        if (a1 != a_out) memcpy(a_out, a1, sizeof(uint16_t) * length1);
        return length1;
    }
    uint16_t s1 = a1[k1];
    uint16_t s2 = a2[k2];
    while (true) {
        if (s1 < s2) {
            a_out[out_card++] = s1;
            ++k1;
            if (k1 >= length1) {
                break;
            }
            s1 = a1[k1];
        } else if (s1 == s2) {
            ++k1;
            ++k2;
            if (k1 >= length1) {
                break;
            }
            if (k2 >= length2) {
                memmove(a_out + out_card, a1 + k1,
                        sizeof(uint16_t) * (length1 - k1));
                return out_card + length1 - k1;
            }
            s1 = a1[k1];
            s2 = a2[k2];
        } else {  // if (val1>val2)
            ++k2;
            if (k2 >= length2) {
                memmove(a_out + out_card, a1 + k1,
                        sizeof(uint16_t) * (length1 - k1));
                return out_card + length1 - k1;
            }
            s2 = a2[k2];
        }
    }
    return out_card;
}